

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void decaf_448_precompute_wnafs(niels_t *out,decaf_448_point_s *base)

{
  long in_RDI;
  int i;
  gf_448_t zis [32];
  gf_448_t zs [32];
  pniels_t tmp [32];
  int local_3064;
  undefined1 local_3060 [28];
  int in_stack_ffffffffffffcfbc;
  gf_448_t *in_stack_ffffffffffffcfc0;
  gf_448_t *in_stack_ffffffffffffcfc8;
  niels_t *in_stack_ffffffffffffcfd0;
  uint in_stack_ffffffffffffd1b4;
  decaf_448_point_s *in_stack_ffffffffffffd1b8;
  pniels_t *in_stack_ffffffffffffd1c0;
  undefined1 local_2860 [2048];
  undefined1 local_2060 [192];
  undefined1 auStack_1fa0 [8024];
  long local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_48 = in_RDI;
  prepare_wnaf_table(in_stack_ffffffffffffd1c0,in_stack_ffffffffffffd1b8,in_stack_ffffffffffffd1b4);
  for (local_3064 = 0; local_3064 < 0x20; local_3064 = local_3064 + 1) {
    memcpy((void *)(local_48 + (long)local_3064 * 0xc0),local_2060 + (long)local_3064 * 0x100,0xc0);
    local_38 = local_2860 + (long)local_3064 * 0x40;
    local_40 = auStack_1fa0 + (long)local_3064 * 0x100;
    memcpy(local_38,local_40,0x40);
  }
  batch_normalize_niels
            (in_stack_ffffffffffffcfd0,in_stack_ffffffffffffcfc8,in_stack_ffffffffffffcfc0,
             in_stack_ffffffffffffcfbc);
  decaf_bzero(local_2060,0x2000);
  decaf_bzero(local_2860,0x800);
  decaf_bzero(local_3060,0x800);
  return;
}

Assistant:

void API_NS(precompute_wnafs) (
    niels_t out[1<<DECAF_WNAF_FIXED_TABLE_BITS],
    const point_t base
) {
    pniels_t tmp[1<<DECAF_WNAF_FIXED_TABLE_BITS];
    gf zs[1<<DECAF_WNAF_FIXED_TABLE_BITS], zis[1<<DECAF_WNAF_FIXED_TABLE_BITS];
    int i;
    prepare_wnaf_table(tmp,base,DECAF_WNAF_FIXED_TABLE_BITS);
    for (i=0; i<1<<DECAF_WNAF_FIXED_TABLE_BITS; i++) {
        memcpy(out[i], tmp[i]->n, sizeof(niels_t));
        gf_copy(zs[i], tmp[i]->z);
    }
    batch_normalize_niels(out, (const gf *)zs, zis, 1<<DECAF_WNAF_FIXED_TABLE_BITS);
    
    decaf_bzero(tmp,sizeof(tmp));
    decaf_bzero(zs,sizeof(zs));
    decaf_bzero(zis,sizeof(zis));
}